

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xarray.c
# Opt level: O0

void xarray_unset(xarray_t *array,xuint index)

{
  uint uVar1;
  uint local_24;
  xarray_block_t *pxStack_20;
  int i;
  xarray_block_t *block;
  xuint index_local;
  xarray_t *array_local;
  
  pxStack_20 = &array->root;
  do {
    uVar1 = index >> (pxStack_20->shift & 0x1f) & 0x3f;
    if (pxStack_20->values[(int)uVar1] == (void *)0x0) {
      return;
    }
    pxStack_20 = (xarray_block_t *)pxStack_20->values[(int)uVar1];
  } while (pxStack_20->shift != '\0');
  local_24 = index & 0x3f;
  if (pxStack_20->values[(int)local_24] != (void *)0x0) {
    if (array->destroy_cb != (xarray_destroy_cb)0x0) {
      (*array->destroy_cb)((void *)((long)pxStack_20->values[(int)local_24] + 0x10));
    }
    free(pxStack_20->values[(int)local_24]);
    array->values = array->values - 1;
    pxStack_20->used = pxStack_20->used + 0xff;
    while ((pxStack_20->used == '\0' &&
           (local_24 = (uint)pxStack_20->parent_pos,
           pxStack_20->parent_block != (xarray_block_t *)0x0))) {
      pxStack_20 = pxStack_20->parent_block;
      free(pxStack_20->values[(int)local_24]);
      array->blocks = array->blocks - 1;
      pxStack_20->used = pxStack_20->used + 0xff;
    }
    pxStack_20->values[(int)local_24] = (void *)0x0;
  }
  return;
}

Assistant:

void xarray_unset(xarray_t* array, xuint index)
{
    xarray_block_t* block = &array->root;
    int i;

    do
    {
        i = (index >> block->shift) & XARRAY_MASK;

        if (block->values[i])
            block = block->values[i];
        else
            return; /* has not been set */
    }
    while (block->shift > 0);

    i = index & XARRAY_MASK;

    if (block->values[i])
    {
        /* destroy a node */
        if (array->destroy_cb)
            array->destroy_cb(xarray_iter_value(
                        (xarray_iter_t)block->values[i]));
#if XARRAY_ENABLE_CACHE
        /* use 'xarray_node_t.block' to store next cache node */
        ((xarray_node_t*)block->values[i])->block
                        = (xarray_block_t*)array->nod_cache;
        array->nod_cache = block->values[i];
#else
        free(block->values[i]);
#endif
        --array->values;
        --block->used;

        /* release block chain if 'used == 0' */
        while (!block->used)
        {
            i = block->parent_pos;

            if (/* unlikely */!block->parent_block)
                break; /* only if unset the last value */

            block = block->parent_block;

            /* destroy a block */
#if XARRAY_ENABLE_CACHE
            /* use 'xarray_block_t.parent_block' to store next cache block */
            ((xarray_block_t*)block->values[i])
                        ->parent_block = array->blk_cache;
            array->blk_cache = block->values[i];
#else
            free(block->values[i]);
#endif
            --array->blocks;
            --block->used;
        }

        block->values[i] = NULL;
    }
}